

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_fstat(void)

{
  uv_buf_t uVar1;
  uv_buf_t uVar2;
  uv_buf_t uVar3;
  uv_buf_t uVar4;
  ssize_t sVar5;
  int iVar6;
  uv_loop_t *puVar7;
  undefined8 uVar8;
  int __fd;
  char *pcVar9;
  stat t;
  uv_fs_t req;
  
  unlink("test_file");
  loop = uv_default_loop();
  iVar6 = uv_fs_open((uv_loop_t *)0x0,&req,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  sVar5 = req.result;
  uVar4.len = iov.len;
  uVar4.base = iov.base;
  if (iVar6 < 0) {
    pcVar9 = "r >= 0";
    uVar8 = 0x52f;
  }
  else if (req.result < 0) {
    pcVar9 = "req.result >= 0";
    uVar8 = 0x530;
    iov = uVar4;
  }
  else {
    uv_fs_req_cleanup(&req);
    __fd = (int)sVar5;
    iVar6 = fstat64(__fd,(stat64 *)&t);
    if (iVar6 == 0) {
      iVar6 = uv_fs_fstat((uv_loop_t *)0x0,&req,__fd,(uv_fs_cb)0x0);
      uVar3.len = iov.len;
      uVar3.base = iov.base;
      uVar2.len = iov.len;
      uVar2.base = iov.base;
      uVar1.len = iov.len;
      uVar1.base = iov.base;
      if (iVar6 == 0) {
        if (req.result == 0) {
          if ((*(long *)((long)req.ptr + 0x90) == 0) ||
             (*(long *)((long)req.ptr + 0x90) == t.st_ctim.tv_sec)) {
            if ((*(long *)((long)req.ptr + 0x98) == 0) ||
               (*(long *)((long)req.ptr + 0x98) == t.st_ctim.tv_nsec)) {
              iov = uv_buf_init(test_buf,0xd);
              iVar6 = uv_fs_write((uv_loop_t *)0x0,&req,__fd,&iov,1,-1,(uv_fs_cb)0x0);
              if (iVar6 == 0xd) {
                if (req.result == 0xd) {
                  uv_fs_req_cleanup(&req);
                  memset(&req.statbuf,0xaa,0xa0);
                  iVar6 = uv_fs_fstat((uv_loop_t *)0x0,&req,__fd,(uv_fs_cb)0x0);
                  if (iVar6 == 0) {
                    if (req.result == 0) {
                      if (*(long *)((long)req.ptr + 0x38) == 0xd) {
                        iVar6 = fstat64(__fd,(stat64 *)&t);
                        if (iVar6 == 0) {
                          if (*req.ptr == t.st_dev) {
                            if (*(ulong *)((long)req.ptr + 8) == (ulong)t.st_mode) {
                              if (*(__nlink_t *)((long)req.ptr + 0x10) == t.st_nlink) {
                                if (*(ulong *)((long)req.ptr + 0x18) == (ulong)t.st_uid) {
                                  if (*(ulong *)((long)req.ptr + 0x20) == (ulong)t.st_gid) {
                                    if (*(__dev_t *)((long)req.ptr + 0x28) == t.st_rdev) {
                                      if (*(__ino_t *)((long)req.ptr + 0x30) == t.st_ino) {
                                        if (*(long *)((long)req.ptr + 0x38) == t.st_size) {
                                          if (*(long *)((long)req.ptr + 0x40) == t.st_blksize) {
                                            if (*(long *)((long)req.ptr + 0x48) == t.st_blocks) {
                                              if (*(long *)((long)req.ptr + 0x60) ==
                                                  t.st_atim.tv_sec) {
                                                if (*(long *)((long)req.ptr + 0x68) ==
                                                    t.st_atim.tv_nsec) {
                                                  if (*(long *)((long)req.ptr + 0x70) ==
                                                      t.st_mtim.tv_sec) {
                                                    if (*(long *)((long)req.ptr + 0x78) ==
                                                        t.st_mtim.tv_nsec) {
                                                      if (*(long *)((long)req.ptr + 0x80) ==
                                                          t.st_ctim.tv_sec) {
                                                        if (*(long *)((long)req.ptr + 0x88) ==
                                                            t.st_ctim.tv_nsec) {
                                                          if (*(long *)((long)req.ptr + 0x50) == 0)
                                                          {
                                                            if (*(long *)((long)req.ptr + 0x58) == 0
                                                               ) {
                                                              uv_fs_req_cleanup(&req);
                                                              iVar6 = uv_fs_fstat(loop,&req,__fd,
                                                                                  fstat_cb);
                                                              if (iVar6 == 0) {
                                                                uv_run(loop,UV_RUN_DEFAULT);
                                                                if (fstat_cb_count == 1) {
                                                                  iVar6 = uv_fs_close((uv_loop_t *)
                                                                                      0x0,&req,__fd,
                                                                                      (uv_fs_cb)0x0)
                                                                  ;
                                                                  if (iVar6 == 0) {
                                                                    if (req.result == 0) {
                                                                      uv_fs_req_cleanup(&req);
                                                                      uv_run(loop,UV_RUN_DEFAULT);
                                                                      unlink("test_file");
                                                                      puVar7 = uv_default_loop();
                                                                      close_loop(puVar7);
                                                                      puVar7 = uv_default_loop();
                                                                      iVar6 = uv_loop_close(puVar7);
                                                                      if (iVar6 == 0) {
                                                                        return 0;
                                                                      }
                                                                      pcVar9 = 
                                                  "0 == uv_loop_close(uv_default_loop())";
                                                  uVar8 = 0x5b5;
                                                  }
                                                  else {
                                                    pcVar9 = "req.result == 0";
                                                    uVar8 = 0x5a9;
                                                  }
                                                  }
                                                  else {
                                                    pcVar9 = "r == 0";
                                                    uVar8 = 0x5a8;
                                                  }
                                                  }
                                                  else {
                                                    pcVar9 = "fstat_cb_count == 1";
                                                    uVar8 = 0x5a4;
                                                  }
                                                  }
                                                  else {
                                                    pcVar9 = "r == 0";
                                                    uVar8 = 0x5a2;
                                                  }
                                                  }
                                                  else {
                                                    pcVar9 = "s->st_gen == 0";
                                                    uVar8 = 0x59b;
                                                  }
                                                  }
                                                  else {
                                                    pcVar9 = "s->st_flags == 0";
                                                    uVar8 = 0x59a;
                                                  }
                                                  }
                                                  else {
                                                    pcVar9 = 
                                                  "s->st_ctim.tv_nsec == t.st_ctim.tv_nsec";
                                                  uVar8 = 0x586;
                                                  }
                                                  }
                                                  else {
                                                    pcVar9 = "s->st_ctim.tv_sec == t.st_ctim.tv_sec"
                                                    ;
                                                    uVar8 = 0x585;
                                                  }
                                                  }
                                                  else {
                                                    pcVar9 = 
                                                  "s->st_mtim.tv_nsec == t.st_mtim.tv_nsec";
                                                  uVar8 = 0x584;
                                                  }
                                                  }
                                                  else {
                                                    pcVar9 = "s->st_mtim.tv_sec == t.st_mtim.tv_sec"
                                                    ;
                                                    uVar8 = 0x583;
                                                  }
                                                }
                                                else {
                                                  pcVar9 = "s->st_atim.tv_nsec == t.st_atim.tv_nsec"
                                                  ;
                                                  uVar8 = 0x582;
                                                }
                                              }
                                              else {
                                                pcVar9 = "s->st_atim.tv_sec == t.st_atim.tv_sec";
                                                uVar8 = 0x581;
                                              }
                                            }
                                            else {
                                              pcVar9 = "s->st_blocks == (uint64_t) t.st_blocks";
                                              uVar8 = 0x561;
                                            }
                                          }
                                          else {
                                            pcVar9 = "s->st_blksize == (uint64_t) t.st_blksize";
                                            uVar8 = 0x560;
                                          }
                                        }
                                        else {
                                          pcVar9 = "s->st_size == (uint64_t) t.st_size";
                                          uVar8 = 0x55f;
                                        }
                                      }
                                      else {
                                        pcVar9 = "s->st_ino == (uint64_t) t.st_ino";
                                        uVar8 = 0x55e;
                                      }
                                    }
                                    else {
                                      pcVar9 = "s->st_rdev == (uint64_t) t.st_rdev";
                                      uVar8 = 0x55d;
                                    }
                                  }
                                  else {
                                    pcVar9 = "s->st_gid == (uint64_t) t.st_gid";
                                    uVar8 = 0x55c;
                                  }
                                }
                                else {
                                  pcVar9 = "s->st_uid == (uint64_t) t.st_uid";
                                  uVar8 = 0x55b;
                                }
                              }
                              else {
                                pcVar9 = "s->st_nlink == (uint64_t) t.st_nlink";
                                uVar8 = 0x55a;
                              }
                            }
                            else {
                              pcVar9 = "s->st_mode == (uint64_t) t.st_mode";
                              uVar8 = 0x559;
                            }
                          }
                          else {
                            pcVar9 = "s->st_dev == (uint64_t) t.st_dev";
                            uVar8 = 0x558;
                          }
                        }
                        else {
                          pcVar9 = "r == 0";
                          uVar8 = 0x556;
                        }
                      }
                      else {
                        pcVar9 = "s->st_size == sizeof(test_buf)";
                        uVar8 = 0x552;
                      }
                    }
                    else {
                      pcVar9 = "req.result == 0";
                      uVar8 = 0x550;
                    }
                  }
                  else {
                    pcVar9 = "r == 0";
                    uVar8 = 0x54f;
                  }
                }
                else {
                  pcVar9 = "req.result == sizeof(test_buf)";
                  uVar8 = 0x54a;
                }
              }
              else {
                pcVar9 = "r == sizeof(test_buf)";
                uVar8 = 0x549;
              }
            }
            else {
              pcVar9 = "s->st_birthtim.tv_nsec == 0 || s->st_birthtim.tv_nsec == t.st_ctim.tv_nsec";
              uVar8 = 0x543;
              iov = uVar1;
            }
          }
          else {
            pcVar9 = "s->st_birthtim.tv_sec == 0 || s->st_birthtim.tv_sec == t.st_ctim.tv_sec";
            uVar8 = 0x541;
            iov = uVar2;
          }
        }
        else {
          pcVar9 = "req.result == 0";
          uVar8 = 0x537;
          iov = uVar3;
        }
      }
      else {
        pcVar9 = "0 == uv_fs_fstat(NULL, &req, file, NULL)";
        uVar8 = 0x536;
      }
    }
    else {
      pcVar9 = "0 == fstat(file, &t)";
      uVar8 = 0x535;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar8,pcVar9);
  abort();
}

Assistant:

TEST_IMPL(fs_fstat) {
  int r;
  uv_fs_t req;
  uv_file file;
  uv_stat_t* s;
#ifndef _WIN32
  struct stat t;
#endif

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

#ifndef _WIN32
  ASSERT(0 == fstat(file, &t));
  ASSERT(0 == uv_fs_fstat(NULL, &req, file, NULL));
  ASSERT(req.result == 0);
  s = req.ptr;
# if defined(__APPLE__)
  ASSERT(s->st_birthtim.tv_sec == t.st_birthtimespec.tv_sec);
  ASSERT(s->st_birthtim.tv_nsec == t.st_birthtimespec.tv_nsec);
# elif defined(__linux__)
  /* If statx() is supported, the birth time should be equal to the change time
   * because we just created the file. On older kernels, it's set to zero.
   */
  ASSERT(s->st_birthtim.tv_sec == 0 ||
         s->st_birthtim.tv_sec == t.st_ctim.tv_sec);
  ASSERT(s->st_birthtim.tv_nsec == 0 ||
         s->st_birthtim.tv_nsec == t.st_ctim.tv_nsec);
# endif
#endif

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  memset(&req.statbuf, 0xaa, sizeof(req.statbuf));
  r = uv_fs_fstat(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  s = req.ptr;
  ASSERT(s->st_size == sizeof(test_buf));

#ifndef _WIN32
  r = fstat(file, &t);
  ASSERT(r == 0);

  ASSERT(s->st_dev == (uint64_t) t.st_dev);
  ASSERT(s->st_mode == (uint64_t) t.st_mode);
  ASSERT(s->st_nlink == (uint64_t) t.st_nlink);
  ASSERT(s->st_uid == (uint64_t) t.st_uid);
  ASSERT(s->st_gid == (uint64_t) t.st_gid);
  ASSERT(s->st_rdev == (uint64_t) t.st_rdev);
  ASSERT(s->st_ino == (uint64_t) t.st_ino);
  ASSERT(s->st_size == (uint64_t) t.st_size);
  ASSERT(s->st_blksize == (uint64_t) t.st_blksize);
  ASSERT(s->st_blocks == (uint64_t) t.st_blocks);
#if defined(__APPLE__)
  ASSERT(s->st_atim.tv_sec == t.st_atimespec.tv_sec);
  ASSERT(s->st_atim.tv_nsec == t.st_atimespec.tv_nsec);
  ASSERT(s->st_mtim.tv_sec == t.st_mtimespec.tv_sec);
  ASSERT(s->st_mtim.tv_nsec == t.st_mtimespec.tv_nsec);
  ASSERT(s->st_ctim.tv_sec == t.st_ctimespec.tv_sec);
  ASSERT(s->st_ctim.tv_nsec == t.st_ctimespec.tv_nsec);
#elif defined(_AIX)
  ASSERT(s->st_atim.tv_sec == t.st_atime);
  ASSERT(s->st_atim.tv_nsec == 0);
  ASSERT(s->st_mtim.tv_sec == t.st_mtime);
  ASSERT(s->st_mtim.tv_nsec == 0);
  ASSERT(s->st_ctim.tv_sec == t.st_ctime);
  ASSERT(s->st_ctim.tv_nsec == 0);
#elif defined(__ANDROID__)
  ASSERT(s->st_atim.tv_sec == t.st_atime);
  ASSERT(s->st_atim.tv_nsec == t.st_atimensec);
  ASSERT(s->st_mtim.tv_sec == t.st_mtime);
  ASSERT(s->st_mtim.tv_nsec == t.st_mtimensec);
  ASSERT(s->st_ctim.tv_sec == t.st_ctime);
  ASSERT(s->st_ctim.tv_nsec == t.st_ctimensec);
#elif defined(__sun)           || \
      defined(__DragonFly__)   || \
      defined(__FreeBSD__)     || \
      defined(__OpenBSD__)     || \
      defined(__NetBSD__)      || \
      defined(_GNU_SOURCE)     || \
      defined(_BSD_SOURCE)     || \
      defined(_SVID_SOURCE)    || \
      defined(_XOPEN_SOURCE)   || \
      defined(_DEFAULT_SOURCE)
  ASSERT(s->st_atim.tv_sec == t.st_atim.tv_sec);
  ASSERT(s->st_atim.tv_nsec == t.st_atim.tv_nsec);
  ASSERT(s->st_mtim.tv_sec == t.st_mtim.tv_sec);
  ASSERT(s->st_mtim.tv_nsec == t.st_mtim.tv_nsec);
  ASSERT(s->st_ctim.tv_sec == t.st_ctim.tv_sec);
  ASSERT(s->st_ctim.tv_nsec == t.st_ctim.tv_nsec);
# if defined(__FreeBSD__)    || \
     defined(__NetBSD__)
  ASSERT(s->st_birthtim.tv_sec == t.st_birthtim.tv_sec);
  ASSERT(s->st_birthtim.tv_nsec == t.st_birthtim.tv_nsec);
# endif
#else
  ASSERT(s->st_atim.tv_sec == t.st_atime);
  ASSERT(s->st_atim.tv_nsec == 0);
  ASSERT(s->st_mtim.tv_sec == t.st_mtime);
  ASSERT(s->st_mtim.tv_nsec == 0);
  ASSERT(s->st_ctim.tv_sec == t.st_ctime);
  ASSERT(s->st_ctim.tv_nsec == 0);
#endif
#endif

#if defined(__APPLE__) || defined(__FreeBSD__) || defined(__NetBSD__)
  ASSERT(s->st_flags == t.st_flags);
  ASSERT(s->st_gen == t.st_gen);
#else
  ASSERT(s->st_flags == 0);
  ASSERT(s->st_gen == 0);
#endif

  uv_fs_req_cleanup(&req);

  /* Now do the uv_fs_fstat call asynchronously */
  r = uv_fs_fstat(loop, &req, file, fstat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(fstat_cb_count == 1);


  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}